

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O0

QJsonValue * __thiscall QJsonValue::operator=(QJsonValue *this,QJsonValue *other)

{
  QJsonValue *in_RDI;
  long in_FS_OFFSET;
  QJsonValue copy;
  QJsonValue *this_00;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QJsonValue *)local_28;
  QJsonValue(this_00,in_RDI);
  swap(this_00,in_RDI);
  ~QJsonValue((QJsonValue *)0x49fb40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QJsonValue &QJsonValue::operator =(const QJsonValue &other) noexcept
{
    QJsonValue copy(other);
    swap(copy);
    return *this;
}